

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

token * __thiscall mjs::parser::get_token(token *__return_storage_ptr__,parser *this)

{
  uint32_t uVar1;
  token *t_00;
  uint32_t old_end;
  parser *this_local;
  token *t;
  
  uVar1 = lexer::text_position(&this->lexer_);
  t_00 = current_token(this);
  token::token(__return_storage_ptr__,t_00);
  next_token(this);
  this->line_break_skipped_ = false;
  this->token_start_ = uVar1;
  skip_whitespace(this);
  return __return_storage_ptr__;
}

Assistant:

token get_token() {
        const auto old_end = lexer_.text_position();
        auto t = current_token();
        next_token();
        line_break_skipped_ = false;
#ifdef PARSER_DEBUG
        std::wcout << source_extend{source_, token_start_, old_end} << " Consuming token: " << t << "\n";
#endif
        token_start_ = old_end;
        skip_whitespace();
        return t;
    }